

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_stub.c
# Opt level: O2

int ld_order(order_t *p,int mode)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = ld_order::count + 1;
  bVar2 = ld_order::count == 0;
  ld_order::count = iVar1;
  if (bVar2) {
    printf("%s %s\n","No load routine has been defined","for the order table");
  }
  return 0;
}

Assistant:

int 
ld_order (order_t *p, int mode)
{
    static int count = 0;

    UNUSED(p);
    UNUSED(mode);
    if (! count++)
        printf("%s %s\n",
            "No load routine has been defined",
            "for the order table");

    return(0);
}